

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O2

void __thiscall QCommandLinkButton::QCommandLinkButton(QCommandLinkButton *this,QWidget *parent)

{
  QCommandLinkButtonPrivate *this_00;
  
  this_00 = (QCommandLinkButtonPrivate *)operator_new(0x2f8);
  QCommandLinkButtonPrivate::QCommandLinkButtonPrivate(this_00);
  QPushButton::QPushButton((QPushButton *)this,(QPushButtonPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_007caa00;
  *(undefined ***)(this + 0x10) = &PTR__QCommandLinkButton_007cabd0;
  QCommandLinkButtonPrivate::init(*(QCommandLinkButtonPrivate **)(this + 8),(EVP_PKEY_CTX *)this_00)
  ;
  return;
}

Assistant:

QCommandLinkButton::QCommandLinkButton(QWidget *parent)
: QPushButton(*new QCommandLinkButtonPrivate, parent)
{
    Q_D(QCommandLinkButton);
    d->init();
}